

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ConflictPoolPropagation::linkWatchedLiteral
          (ConflictPoolPropagation *this,HighsInt linkPos)

{
  int iVar1;
  reference pvVar2;
  int in_ESI;
  long in_RDI;
  HighsInt *head;
  int *local_28;
  
  pvVar2 = std::
           vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
           ::operator[]((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                         *)(in_RDI + 0x78),(long)in_ESI);
  if ((pvVar2->domchg).boundtype == kLower) {
    pvVar2 = std::
             vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
             ::operator[]((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                           *)(in_RDI + 0x78),(long)in_ESI);
    local_28 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18),
                          (long)(pvVar2->domchg).column);
  }
  else {
    pvVar2 = std::
             vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
             ::operator[]((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                           *)(in_RDI + 0x78),(long)in_ESI);
    local_28 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),
                          (long)(pvVar2->domchg).column);
  }
  pvVar2 = std::
           vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
           ::operator[]((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                         *)(in_RDI + 0x78),(long)in_ESI);
  pvVar2->prev = -1;
  iVar1 = *local_28;
  pvVar2 = std::
           vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
           ::operator[]((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                         *)(in_RDI + 0x78),(long)in_ESI);
  pvVar2->next = iVar1;
  if (*local_28 != -1) {
    pvVar2 = std::
             vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
             ::operator[]((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                           *)(in_RDI + 0x78),(long)*local_28);
    pvVar2->prev = in_ESI;
    *local_28 = in_ESI;
  }
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::linkWatchedLiteral(
    HighsInt linkPos) {
  assert(watchedLiterals_[linkPos].domchg.column != -1);
  HighsInt& head =
      watchedLiterals_[linkPos].domchg.boundtype == HighsBoundType::kLower
          ? colLowerWatched_[watchedLiterals_[linkPos].domchg.column]
          : colUpperWatched_[watchedLiterals_[linkPos].domchg.column];

  watchedLiterals_[linkPos].prev = -1;
  watchedLiterals_[linkPos].next = head;
  if (head != -1) {
    watchedLiterals_[head].prev = linkPos;
    head = linkPos;
  }
}